

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetCurrentWindow(ImGuiWindow *window)

{
  ImGuiTable *pIVar1;
  ImGuiWindow *in_RDI;
  float fVar2;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffe8;
  ImGuiContext *this;
  
  this = GImGui;
  GImGui->CurrentWindow = in_RDI;
  if ((in_RDI == (ImGuiWindow *)0x0) || ((in_RDI->DC).CurrentTableIdx == -1)) {
    pIVar1 = (ImGuiTable *)0x0;
  }
  else {
    pIVar1 = ImPool<ImGuiTable>::GetByIndex
                       ((ImPool<ImGuiTable> *)this,
                        (ImPoolIdx)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  }
  this->CurrentTable = pIVar1;
  if (in_RDI != (ImGuiWindow *)0x0) {
    fVar2 = ImGuiWindow::CalcFontSize(in_RDI);
    (this->DrawListSharedData).FontSize = fVar2;
    this->FontSize = fVar2;
  }
  return;
}

Assistant:

static void SetCurrentWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow = window;
    g.CurrentTable = window && window->DC.CurrentTableIdx != -1 ? g.Tables.GetByIndex(window->DC.CurrentTableIdx) : NULL;
    if (window)
        g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}